

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O2

NamespaceDeclaration * __thiscall
QXmlStreamWriterPrivate::findNamespace
          (QXmlStreamWriterPrivate *this,QAnyStringView namespaceUri,bool writeDeclaration,
          bool noDefault)

{
  long lVar1;
  NamespaceDeclaration *pNVar2;
  Data *pDVar3;
  qsizetype qVar4;
  bool bVar5;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar6;
  ulong uVar7;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 *namespaceDeclaration;
  XmlStringRef *pXVar8;
  int n;
  long lVar9;
  NamespaceDeclaration *pNVar10;
  long lVar11;
  long in_FS_OFFSET;
  QStringView rhs;
  QAnyStringView s;
  QAnyStringView s_00;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 local_c8;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aStack_c0;
  undefined8 local_b8;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 local_a8;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aStack_a0;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aStack_98;
  undefined8 local_90;
  QArrayDataPointer<char16_t> local_88;
  QArrayDataPointer<char16_t> local_68;
  QAnyStringView namespaceUri_local;
  
  namespaceUri_local.m_size = namespaceUri.m_size;
  namespaceUri_local.field_0 = namespaceUri.field_0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pNVar2 = (this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.data;
  lVar9 = (this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.tos;
  lVar11 = lVar9 * 0x30;
  pNVar10 = pNVar2 + lVar9 + 1;
  do {
    if (lVar11 == -0x30) {
      if ((namespaceUri_local.m_size & 0x3fffffffffffffff) == 0) {
        namespaceDeclaration = (anon_union_8_3_8ad491a7_for_QAnyStringView_6 *)&this->emptyNamespace
        ;
      }
      else {
        namespaceDeclaration =
             (anon_union_8_3_8ad491a7_for_QAnyStringView_6 *)
             QXmlStreamSimpleStack<QXmlStreamPrivateTagStack::NamespaceDeclaration>::push
                       ((QXmlStreamSimpleStack<QXmlStreamPrivateTagStack::NamespaceDeclaration> *)
                        this);
        if ((namespaceUri_local.m_size & 0x3fffffffffffffff) != 0) {
          local_68.d = (Data *)0x0;
          local_68.ptr = (char16_t *)0x0;
          local_68.size = 0;
          n = this->namespacePrefixCount + 1;
          this->namespacePrefixCount = n;
          do {
            QString::number((QString *)&local_c8,n,10);
            local_90 = local_b8;
            aStack_98 = aStack_c0;
            aStack_a0 = local_c8;
            local_a8._0_2_ = 0x6e;
            local_c8.m_data = (void *)0x0;
            aStack_c0.m_data = (void *)0x0;
            local_b8 = 0;
            QStringBuilder<char16_t,_QString>::convertTo<QString>
                      ((QString *)&local_88,(QStringBuilder<char16_t,_QString> *)&local_a8);
            qVar4 = local_68.size;
            pXVar8 = (XmlStringRef *)local_88.size;
            n = n + 1;
            pDVar3 = (Data *)CONCAT44(local_88.d._4_4_,local_88.d._0_4_);
            aVar6._4_4_ = local_88.ptr._4_4_;
            aVar6._0_4_ = local_88.ptr._0_4_;
            local_88.d._0_4_ = local_68.d._0_4_;
            local_88.d._4_4_ = local_68.d._4_4_;
            local_88.ptr._0_4_ = local_68.ptr._0_4_;
            local_88.ptr._4_4_ = local_68.ptr._4_4_;
            local_68.size = local_88.size;
            local_88.size = qVar4;
            local_68.d = pDVar3;
            local_68.ptr = aVar6.m_data_utf16;
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&aStack_a0);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&local_c8);
            lVar9 = (this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.tos;
            lVar11 = lVar9 + 1;
            lVar9 = lVar9 * 0x30;
            do {
              lVar11 = lVar11 + -1;
              if (lVar11 < 1) {
                s.m_size = local_68.size | 0x8000000000000000;
                s.field_0.m_data = local_68.ptr;
                QXmlStreamPrivateTagStack::addToStringStorage
                          ((XmlStringRef *)&local_a8,&this->super_QXmlStreamPrivateTagStack,s);
                namespaceDeclaration[2] = aStack_98;
                *namespaceDeclaration = local_a8;
                namespaceDeclaration[1] = aStack_a0;
                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
                goto LAB_003576df;
              }
              rhs.m_data = (storage_type_conflict *)pXVar8;
              rhs.m_size = (qsizetype)local_68.ptr;
              bVar5 = QtPrivate::operator!=
                                ((QtPrivate *)
                                 ((long)&(this->super_QXmlStreamPrivateTagStack).
                                         namespaceDeclarations.data[-1].prefix.m_string + lVar9),
                                 (XmlStringRef *)local_68.size,rhs);
              lVar9 = lVar9 + -0x30;
            } while (bVar5);
          } while( true );
        }
        namespaceDeclaration->m_data = (void *)0x0;
        namespaceDeclaration[1].m_data = (void *)0x0;
        namespaceDeclaration[2].m_data = (void *)0x0;
LAB_003576df:
        s_00.m_size = namespaceUri_local.m_size;
        s_00.field_0.m_data = namespaceUri_local.field_0.m_data;
        QXmlStreamPrivateTagStack::addToStringStorage
                  ((XmlStringRef *)&local_a8,&this->super_QXmlStreamPrivateTagStack,s_00);
        namespaceDeclaration[5] = aStack_98;
        namespaceDeclaration[3] = local_a8;
        namespaceDeclaration[4] = aStack_a0;
        if (writeDeclaration) {
          writeNamespaceDeclaration(this,(NamespaceDeclaration *)namespaceDeclaration);
        }
      }
LAB_00357718:
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
        __stack_chk_fail();
      }
      return (NamespaceDeclaration *)namespaceDeclaration;
    }
    aVar6.m_data_utf16 = &QtPrivate::XmlStringRef::data(&pNVar10[-1].namespaceUri)->ucs;
    uVar7 = QtPrivate::XmlStringRef::size(&pNVar10[-1].namespaceUri);
    aStack_a0.m_data = (void *)(uVar7 | 0x8000000000000000);
    local_a8.m_data_utf16 = aVar6.m_data_utf16;
    bVar5 = ::comparesEqual((QAnyStringView *)&local_a8,&namespaceUri_local);
    if ((bVar5) && ((!noDefault || (*(long *)((long)&(pNVar2->prefix).m_size + lVar11) != 0)))) {
      namespaceDeclaration =
           (anon_union_8_3_8ad491a7_for_QAnyStringView_6 *)
           ((long)&(pNVar2->prefix).m_string + lVar11);
      goto LAB_00357718;
    }
    pNVar10 = pNVar10 + -1;
    lVar11 = lVar11 + -0x30;
  } while( true );
}

Assistant:

QXmlStreamPrivateTagStack::NamespaceDeclaration &QXmlStreamWriterPrivate::findNamespace(QAnyStringView namespaceUri, bool writeDeclaration, bool noDefault)
{
    for (NamespaceDeclaration &namespaceDeclaration : reversed(namespaceDeclarations)) {
        if (namespaceDeclaration.namespaceUri == namespaceUri) {
            if (!noDefault || !namespaceDeclaration.prefix.isEmpty())
                return namespaceDeclaration;
        }
    }
    if (namespaceUri.isEmpty())
        return emptyNamespace;
    NamespaceDeclaration &namespaceDeclaration = namespaceDeclarations.push();
    if (namespaceUri.isEmpty()) {
        namespaceDeclaration.prefix.clear();
    } else {
        QString s;
        int n = ++namespacePrefixCount;
        forever {
            s = u'n' + QString::number(n++);
            qsizetype j = namespaceDeclarations.size() - 2;
            while (j >= 0 && namespaceDeclarations.at(j).prefix != s)
                --j;
            if (j < 0)
                break;
        }
        namespaceDeclaration.prefix = addToStringStorage(s);
    }